

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O2

long ov_bitrate(OggVorbis_File *vf,int i)

{
  uint uVar1;
  long lVar2;
  vorbis_info *pvVar3;
  ulong uVar4;
  int i_00;
  long lVar5;
  ulong uVar6;
  float fVar7;
  double dVar8;
  ulong uStack_10;
  
  uStack_10 = 0xffffffffffffff7d;
  if (1 < vf->ready_state) {
    uVar1 = vf->links;
    uVar6 = (ulong)(uint)i;
    do {
      uVar4 = uVar6;
      i_00 = (int)uVar4;
      if ((int)uVar1 <= i_00) {
        return -0x83;
      }
    } while ((i_00 != 0) && (uVar6 = 0, vf->seekable == 0));
    if (i_00 < 0) {
      uVar4 = 0;
      uVar6 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar6 = uVar4;
      }
      lVar5 = 0;
      for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        lVar5 = lVar5 + (vf->offsets[uVar4 + 1] - vf->dataoffsets[uVar4]) * 8;
      }
      dVar8 = ov_time_total(vf,-1);
      fVar7 = rintf((float)((double)lVar5 / dVar8));
      uStack_10 = (ulong)fVar7;
    }
    else if (vf->seekable == 0) {
      pvVar3 = vf->vi;
      uStack_10 = pvVar3[uVar4].bitrate_nominal;
      if ((long)uStack_10 < 1) {
        uStack_10 = pvVar3[uVar4].bitrate_upper;
        if ((long)uStack_10 < 1) {
          uStack_10 = 0xffffffffffffffff;
        }
        else if (0 < pvVar3[uVar4].bitrate_lower) {
          uStack_10 = pvVar3[uVar4].bitrate_lower + uStack_10 >> 1;
        }
      }
    }
    else {
      lVar5 = vf->offsets[uVar4 + 1];
      lVar2 = vf->dataoffsets[uVar4];
      dVar8 = ov_time_total(vf,i_00);
      dVar8 = rint((double)((lVar5 - lVar2) * 8) / dVar8);
      uStack_10 = (ulong)dVar8;
    }
  }
  return uStack_10;
}

Assistant:

long ov_bitrate(OggVorbis_File *vf,int i){
  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(i>=vf->links)return(OV_EINVAL);
  if(!vf->seekable && i!=0)return(ov_bitrate(vf,0));
  if(i<0){
    ogg_int64_t bits=0;
    int i;
    float br;
    for(i=0;i<vf->links;i++)
      bits+=(vf->offsets[i+1]-vf->dataoffsets[i])*8;
    /* This once read: return(rint(bits/ov_time_total(vf,-1)));
     * gcc 3.x on x86 miscompiled this at optimisation level 2 and above,
     * so this is slightly transformed to make it work.
     */
    br = bits/ov_time_total(vf,-1);
    return(rint(br));
  }else{
    if(vf->seekable){
      /* return the actual bitrate */
      return(rint((vf->offsets[i+1]-vf->dataoffsets[i])*8/ov_time_total(vf,i)));
    }else{
      /* return nominal if set */
      if(vf->vi[i].bitrate_nominal>0){
        return vf->vi[i].bitrate_nominal;
      }else{
        if(vf->vi[i].bitrate_upper>0){
          if(vf->vi[i].bitrate_lower>0){
            return (vf->vi[i].bitrate_upper+vf->vi[i].bitrate_lower)/2;
          }else{
            return vf->vi[i].bitrate_upper;
          }
        }
        return(OV_FALSE);
      }
    }
  }
}